

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

int http_sendfile2(http_s *h,char *prefix,size_t prefix_len,char *encoded,size_t encoded_len)

{
  int *piVar1;
  byte bVar2;
  fio_str_info_s n;
  fio_str_info_s v;
  long lVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  FIOBJ FVar7;
  fiobj_object_vtable_s *pfVar8;
  FIOBJ FVar9;
  char *pcVar10;
  size_t sVar11;
  FIOBJ FVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  size_t __n;
  void *pvVar18;
  uintptr_t offset;
  char *pos;
  http_s *phVar19;
  byte bVar20;
  long lVar21;
  byte bVar22;
  undefined4 uVar23;
  undefined7 uVar24;
  char cVar25;
  void *pvVar27;
  bool bVar28;
  fio_str_info_s s;
  fio_str_info_s ac_str;
  fio_str_info_s ret_7;
  fio_str_info_s ret_11;
  fio_str_info_s ret_9;
  uint64_t etag;
  stat file_data;
  fio_str_info_s local_1a8;
  fio_str_info_s local_188;
  http_s *local_170;
  fio_str_info_s local_168;
  ulong local_148;
  undefined4 local_13c;
  fio_str_info_s local_138;
  fio_str_info_s local_118;
  FIOBJ local_100;
  ulong local_f8 [3];
  char *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  char *local_c8;
  stat local_c0;
  uint uVar26;
  
  if (h == (http_s *)0x0) {
    return -1;
  }
  if (((h->method == 0) && (h->status_str == 0)) && (h->status != 0)) {
    return -1;
  }
  local_170 = h;
  memset(&local_c0,0,0x90);
  if (http_sendfile2::accept_enc_hash == 0) {
    http_sendfile2::accept_enc_hash = fio_siphash13("accept-encoding",0xf,0x144e87,0x1453b6);
  }
  if (http_sendfile2::range_hash == 0) {
    http_sendfile2::range_hash = fio_siphash13("range",5,0x144e87,0x1453b6);
  }
  FVar7 = fiobj_str_tmp();
  if (prefix_len != 0 && prefix != (char *)0x0) {
    if ((encoded != (char *)0x0) && (prefix[prefix_len - 1] == '/')) {
      prefix_len = prefix_len - (*encoded == '/');
    }
    fiobj_str_capa_assert(FVar7,prefix_len + encoded_len + 4);
    fiobj_str_write(FVar7,prefix,prefix_len);
  }
  cVar25 = (char)FVar7;
  uVar26 = (uint)FVar7;
  lVar14 = (long)FVar7 >> 1;
  if (FVar7 == 0) {
LAB_00147911:
    local_1a8.data = anon_var_dwarf_20f;
    uVar16 = 4;
    goto LAB_00147924;
  }
  if ((FVar7 & 1) == 0) {
    cVar4 = '(';
    switch(uVar26 & 6) {
    case 0:
switchD_001478c8_caseD_0:
      cVar4 = *(char *)(FVar7 & 0xfffffffffffffff8);
      break;
    case 4:
switchD_001478c8_caseD_4:
      cVar4 = '*';
      break;
    case 6:
      if (cVar25 == '&') {
        local_1a8.data = anon_var_dwarf_21a;
        uVar16 = 5;
      }
      else {
        if ((uVar26 & 0xff) != 0x16) {
          if ((uVar26 & 0xff) == 6) goto LAB_00147911;
          switch(uVar26 & 6) {
          case 0:
            goto switchD_001478c8_caseD_0;
          case 4:
            goto switchD_001478c8_caseD_4;
          case 6:
            cVar4 = cVar25;
          }
          break;
        }
        local_1a8.data = anon_var_dwarf_225;
        uVar16 = 4;
      }
LAB_00147924:
      local_1a8.capa = 0;
      local_1a8.len = (size_t)uVar16;
      goto LAB_001479c4;
    }
    switch(cVar4) {
    case '\'':
      pfVar8 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar8 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar8 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar8 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar8 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar8 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar8->to_str)(&local_1a8,FVar7);
  }
  else {
    fio_ltocstr(&local_1a8,lVar14);
  }
LAB_001479c4:
  if (encoded != (char *)0x0) {
    if (0 < (long)encoded_len) {
      encoded_len = (size_t)(encoded + encoded_len);
      do {
        cVar4 = *encoded;
        if (cVar4 == '%') {
          bVar2 = encoded[1];
          bVar20 = bVar2 - 0x30;
          if (9 < bVar20) {
            if (0x25 < bVar2 - 0x41) {
              return -1;
            }
            if ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0) {
              return -1;
            }
            bVar20 = bVar2 + 0xa9;
          }
          *(byte *)((long)local_1a8.data + local_1a8.len) = bVar20 << 4;
          bVar2 = encoded[2];
          bVar22 = bVar2 - 0x30;
          if (9 < bVar22) {
            if (0x25 < bVar2 - 0x41) {
              return -1;
            }
            if ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0) {
              return -1;
            }
            bVar22 = (bVar2 | 0x20) + 0xa9;
          }
          *(byte *)((long)local_1a8.data + local_1a8.len) = bVar22 | bVar20 << 4;
          encoded = encoded + 3;
        }
        else {
          encoded = encoded + 1;
          *(char *)((long)local_1a8.data + local_1a8.len) = cVar4;
        }
        local_1a8.len = local_1a8.len + 1;
      } while (encoded < encoded_len);
    }
    *(undefined1 *)((long)local_1a8.data + local_1a8.len) = 0;
    fiobj_str_resize(FVar7,local_1a8.len);
    __n = local_1a8.len - prefix_len;
    if (0 < (long)__n) {
      pvVar18 = (void *)(local_1a8.len + (long)local_1a8.data);
      pvVar27 = (void *)(prefix_len + (long)local_1a8.data);
      do {
        pvVar27 = memchr(pvVar27,0x2f,__n);
        if (pvVar27 == (void *)0x0) break;
        if ((*(char *)((long)pvVar27 + 1) == '/') ||
           (((__n = (long)pvVar18 - (long)pvVar27, 3 < __n && (*(char *)((long)pvVar27 + 1) == '.'))
            && ((*(char *)((long)pvVar27 + 2) == '.' && (*(char *)((long)pvVar27 + 3) == '/')))))) {
          return -1;
        }
        pvVar27 = (void *)((long)pvVar27 + 1);
      } while (pvVar27 < pvVar18);
    }
  }
  if (*(char *)((long)local_1a8.data + (local_1a8.len - 1)) == '/') {
    fiobj_str_write(FVar7,"index.html",10);
  }
  phVar19 = local_170;
  if (FVar7 == 0) {
LAB_00147b96:
    local_1a8.data = anon_var_dwarf_20f;
    uVar16 = 4;
    goto LAB_00147ba9;
  }
  if ((FVar7 & 1) == 0) {
    cVar4 = '(';
    switch(uVar26 & 6) {
    case 0:
switchD_00147b52_caseD_0:
      cVar4 = *(char *)(FVar7 & 0xfffffffffffffff8);
      break;
    case 4:
switchD_00147b52_caseD_4:
      cVar4 = '*';
      break;
    case 6:
      if (cVar25 == '&') {
        local_1a8.data = anon_var_dwarf_21a;
        uVar16 = 5;
      }
      else {
        if ((uVar26 & 0xff) != 0x16) {
          if ((uVar26 & 0xff) == 6) goto LAB_00147b96;
          switch(uVar26 & 6) {
          case 0:
            goto switchD_00147b52_caseD_0;
          case 4:
            goto switchD_00147b52_caseD_4;
          case 6:
            cVar4 = cVar25;
          }
          break;
        }
        local_1a8.data = anon_var_dwarf_225;
        uVar16 = 4;
      }
LAB_00147ba9:
      local_1a8.capa = 0;
      local_1a8.len = (size_t)uVar16;
      goto LAB_00147c49;
    }
    switch(cVar4) {
    case '\'':
      pfVar8 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar8 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar8 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar8 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar8 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar8 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar8->to_str)(&local_1a8,FVar7);
  }
  else {
    fio_ltocstr(&local_1a8,lVar14);
  }
LAB_00147c49:
  FVar9 = fiobj_hash_get2(phVar19->headers,http_sendfile2::accept_enc_hash);
  uVar24 = (undefined7)(encoded_len >> 8);
  if (FVar9 == 0) {
    iVar5 = 4;
    uVar23 = (undefined4)CONCAT71(uVar24,1);
  }
  else {
    if ((FVar9 & 1) == 0) {
      uVar16 = (uint)FVar9 & 6;
      cVar4 = '(';
      switch(uVar16) {
      case 0:
switchD_00147c77_caseD_0:
        cVar4 = *(char *)(FVar9 & 0xfffffffffffffff8);
        break;
      case 4:
switchD_00147c77_caseD_4:
        cVar4 = '*';
        break;
      case 6:
        if ((char)FVar9 == '&') {
          local_188.data = anon_var_dwarf_21a;
          local_188.len._0_4_ = 5;
        }
        else {
          uVar17 = (uint)FVar9 & 0xff;
          if (uVar17 == 0x16) {
            local_188.data = anon_var_dwarf_225;
            local_188.len._0_4_ = 4;
          }
          else {
            if (uVar17 != 6) {
              switch(uVar16) {
              case 0:
                goto switchD_00147c77_caseD_0;
              case 4:
                goto switchD_00147c77_caseD_4;
              case 6:
                cVar4 = (char)FVar9;
              }
              break;
            }
            local_188.data = anon_var_dwarf_20f;
            local_188.len._0_4_ = 4;
          }
        }
        local_188.capa._0_4_ = 0;
        local_188.capa._4_4_ = 0;
        local_188.len._4_4_ = 0;
        goto LAB_00147d6a;
      }
      switch(cVar4) {
      case '\'':
        pfVar8 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        pfVar8 = &FIOBJECT_VTABLE_STRING;
        break;
      case ')':
        pfVar8 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        pfVar8 = &FIOBJECT_VTABLE_HASH;
        break;
      case '+':
        pfVar8 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar8 = &FIOBJECT_VTABLE_NUMBER;
      }
      (*pfVar8->to_str)(&local_188,FVar9);
    }
    else {
      fio_ltocstr(&local_188,(long)FVar9 >> 1);
    }
LAB_00147d6a:
    iVar5 = 4;
    uVar23 = (undefined4)CONCAT71(uVar24,1);
    if ((((int *)local_188.data != (int *)0x0) &&
        (pcVar10 = strstr(local_188.data,"gzip"), pcVar10 != (char *)0x0)) &&
       ((*(char *)((long)local_1a8.data + (local_1a8.len - 3)) != '.' ||
        ((*(char *)((long)local_1a8.data + (local_1a8.len - 2)) != 'g' ||
         (iVar5 = 0, *(char *)((long)local_1a8.data + (local_1a8.len - 1)) != 'z')))))) {
      fiobj_str_write(FVar7,".gz",3);
      if (FVar7 == 0) {
LAB_00147e28:
        local_168.data = anon_var_dwarf_20f;
        local_168.len._0_4_ = 4;
        goto LAB_00147e3e;
      }
      if ((FVar7 & 1) == 0) {
        cVar4 = '(';
        switch(uVar26 & 6) {
        case 0:
switchD_00147def_caseD_0:
          cVar4 = *(char *)(FVar7 & 0xfffffffffffffff8);
          break;
        case 4:
switchD_00147def_caseD_4:
          cVar4 = '*';
          break;
        case 6:
          if (cVar25 == '&') {
            local_168.data = anon_var_dwarf_21a;
            local_168.len._0_4_ = 5;
          }
          else {
            if ((uVar26 & 0xff) != 0x16) {
              if ((uVar26 & 0xff) == 6) goto LAB_00147e28;
              switch(uVar26 & 6) {
              case 0:
                goto switchD_00147def_caseD_0;
              case 4:
                goto switchD_00147def_caseD_4;
              case 6:
                cVar4 = cVar25;
              }
              break;
            }
            local_168.data = anon_var_dwarf_225;
            local_168.len._0_4_ = 4;
          }
LAB_00147e3e:
          local_168.capa = 0;
          local_168.len._4_4_ = 0;
          goto LAB_00147efb;
        }
        switch(cVar4) {
        case '\'':
          pfVar8 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case '(':
          pfVar8 = &FIOBJECT_VTABLE_STRING;
          break;
        case ')':
          pfVar8 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case '*':
          pfVar8 = &FIOBJECT_VTABLE_HASH;
          break;
        case '+':
          pfVar8 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar8 = &FIOBJECT_VTABLE_NUMBER;
        }
        (*pfVar8->to_str)(&local_168,FVar7);
      }
      else {
        fio_ltocstr(&local_168,lVar14);
      }
LAB_00147efb:
      local_1a8.data = local_168.data;
      local_1a8.len = CONCAT44(local_168.len._4_4_,(undefined4)local_168.len);
      local_1a8.capa = local_168.capa;
      iVar5 = stat(local_168.data,&local_c0);
      if ((iVar5 == 0) && ((local_c0.st_mode & 0xd000 | 0x2000) == 0xa000)) {
        iVar5 = 5;
        uVar23 = 0;
      }
      else {
        fiobj_str_resize(FVar7,local_1a8.len - 3);
        iVar5 = 0;
      }
    }
  }
  if (iVar5 == 0) {
LAB_00147f70:
    iVar5 = stat(local_1a8.data,&local_c0);
    if (iVar5 != 0) {
      return -1;
    }
    if ((local_c0.st_mode & 0xd000 | 0x2000) != 0xa000) {
      return -1;
    }
  }
  else if (iVar5 != 5) {
    if (iVar5 != 4) {
      return -1;
    }
    goto LAB_00147f70;
  }
  FVar9 = fiobj_str_buf(0x20);
  if (FVar9 == 0) {
LAB_00148010:
    local_118.data = anon_var_dwarf_20f;
    local_118.len._0_4_ = 4;
    goto LAB_00148026;
  }
  if ((FVar9 & 1) == 0) {
    uVar16 = (uint)FVar9 & 6;
    cVar4 = '(';
    switch(uVar16) {
    case 0:
switchD_00147fd4_caseD_0:
      cVar4 = *(char *)(FVar9 & 0xfffffffffffffff8);
      break;
    case 4:
switchD_00147fd4_caseD_4:
      cVar4 = '*';
      break;
    case 6:
      if ((char)FVar9 == '&') {
        local_118.data = anon_var_dwarf_21a;
        local_118.len._0_4_ = 5;
      }
      else {
        uVar17 = (uint)FVar9 & 0xff;
        if (uVar17 != 0x16) {
          if (uVar17 == 6) goto LAB_00148010;
          switch(uVar16) {
          case 0:
            goto switchD_00147fd4_caseD_0;
          case 4:
            goto switchD_00147fd4_caseD_4;
          case 6:
            cVar4 = (char)FVar9;
          }
          break;
        }
        local_118.data = anon_var_dwarf_225;
        local_118.len._0_4_ = 4;
      }
LAB_00148026:
      local_118.capa._0_4_ = 0;
      local_118.capa._4_4_ = 0;
      local_118.len._4_4_ = 0;
      goto LAB_001480d2;
    }
    switch(cVar4) {
    case '\'':
      pfVar8 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar8 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar8 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar8 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar8 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar8 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar8->to_str)(&local_118,FVar9);
  }
  else {
    fio_ltocstr(&local_118,(long)FVar9 >> 1);
  }
LAB_001480d2:
  local_13c = uVar23;
  sVar11 = http_time2str(local_118.data,local_c0.st_mtim.tv_sec);
  fiobj_str_resize(FVar9,sVar11);
  http_set_header(phVar19,HTTP_HEADER_LAST_MODIFIED,FVar9);
  FVar12 = HTTP_HVALUE_MAX_AGE;
  FVar9 = HTTP_HEADER_CACHE_CONTROL;
  if ((((~(uint)HTTP_HVALUE_MAX_AGE & 6) != 0) && (HTTP_HVALUE_MAX_AGE != 0)) &&
     ((HTTP_HVALUE_MAX_AGE & 1) == 0)) {
    LOCK();
    piVar1 = (int *)((HTTP_HVALUE_MAX_AGE & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  http_set_header(phVar19,FVar9,FVar12);
  local_f8[0] = local_c0.st_mtim.tv_sec ^ local_c0.st_size;
  local_f8[0] = fio_siphash13(local_f8,8,0x144e87,0x1453b6);
  FVar9 = fiobj_str_buf(0x20);
  if (FVar9 == 0) {
LAB_001481f0:
    local_138.data = anon_var_dwarf_20f;
    local_138.len._0_4_ = 4;
    goto LAB_00148206;
  }
  if ((FVar9 & 1) == 0) {
    uVar16 = (uint)FVar9 & 6;
    cVar4 = '(';
    switch(uVar16) {
    case 0:
switchD_001481b4_caseD_0:
      cVar4 = *(char *)(FVar9 & 0xfffffffffffffff8);
      break;
    case 4:
switchD_001481b4_caseD_4:
      cVar4 = '*';
      break;
    case 6:
      if ((char)FVar9 == '&') {
        local_138.data = anon_var_dwarf_21a;
        local_138.len._0_4_ = 5;
      }
      else {
        uVar17 = (uint)FVar9 & 0xff;
        if (uVar17 != 0x16) {
          if (uVar17 == 6) goto LAB_001481f0;
          switch(uVar16) {
          case 0:
            goto switchD_001481b4_caseD_0;
          case 4:
            goto switchD_001481b4_caseD_4;
          case 6:
            cVar4 = (char)FVar9;
          }
          break;
        }
        local_138.data = anon_var_dwarf_225;
        local_138.len._0_4_ = 4;
      }
LAB_00148206:
      local_138.capa._0_4_ = 0;
      local_138.capa._4_4_ = 0;
      local_138.len._4_4_ = 0;
      goto LAB_001482b2;
    }
    switch(cVar4) {
    case '\'':
      pfVar8 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar8 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar8 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar8 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar8 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar8 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar8->to_str)(&local_138,FVar9);
  }
  else {
    fio_ltocstr(&local_138,(long)FVar9 >> 1);
  }
LAB_001482b2:
  iVar5 = fio_base64_encode(local_138.data,(char *)local_f8,8);
  fiobj_str_resize(FVar9,(long)iVar5);
  http_set_header(phVar19,HTTP_HEADER_ETAG,FVar9);
  if (http_sendfile2::none_match_hash == 0) {
    http_sendfile2::none_match_hash = fio_siphash13("if-none-match",0xd,0x144e87,0x1453b6);
  }
  FVar12 = fiobj_hash_get2(phVar19->headers,http_sendfile2::none_match_hash);
  iVar5 = -1;
  bVar28 = true;
  if ((FVar12 != 0) && (iVar6 = fiobj_iseq(FVar12,FVar9), iVar6 != 0)) {
    phVar19->status = 0x130;
    http_finish(phVar19);
    bVar28 = false;
    iVar5 = 0;
  }
  if (!bVar28) {
    return iVar5;
  }
  if (http_sendfile2::ifrange_hash == 0) {
    http_sendfile2::ifrange_hash = fio_siphash13("if-range",8,0x144e87,0x1453b6);
  }
  FVar12 = fiobj_hash_get2(phVar19->headers,http_sendfile2::ifrange_hash);
  if ((FVar12 == 0) || (iVar6 = fiobj_iseq(FVar12,FVar9), iVar6 == 0)) {
    uVar13 = fiobj_hash_get2(phVar19->headers,http_sendfile2::range_hash);
    if (uVar13 == 0) goto LAB_00148439;
    if (((~(uint)uVar13 & 6) != 0 && (uVar13 & 1) == 0) &&
       (*(char *)(uVar13 & 0xfffffffffffffff8) == ')')) {
      uVar13 = fiobj_ary_index(uVar13,0);
    }
    if (uVar13 == 0) {
LAB_001484c9:
      local_188.data = anon_var_dwarf_20f;
      local_188.len._0_4_ = 4;
      goto LAB_001484dc;
    }
    if ((uVar13 & 1) == 0) {
      uVar16 = (uint)uVar13 & 6;
      cVar4 = '(';
      switch(uVar16) {
      case 0:
switchD_00148429_caseD_0:
        cVar4 = *(char *)(uVar13 & 0xfffffffffffffff8);
        break;
      case 4:
switchD_00148429_caseD_4:
        cVar4 = '*';
        break;
      case 6:
        if ((char)uVar13 == '&') {
          local_188.data = anon_var_dwarf_21a;
          local_188.len._0_4_ = 5;
        }
        else {
          uVar17 = (uint)uVar13 & 0xff;
          if (uVar17 != 0x16) {
            if (uVar17 == 6) goto LAB_001484c9;
            switch(uVar16) {
            case 0:
              goto switchD_00148429_caseD_0;
            case 4:
              goto switchD_00148429_caseD_4;
            case 6:
              cVar4 = (char)uVar13;
            }
            break;
          }
          local_188.data = anon_var_dwarf_225;
          local_188.len._0_4_ = 4;
        }
LAB_001484dc:
        local_188.capa._0_4_ = 0;
        local_188.capa._4_4_ = 0;
        local_188.len._4_4_ = 0;
        goto LAB_001485cc;
      }
      switch(cVar4) {
      case '\'':
        pfVar8 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        pfVar8 = &FIOBJECT_VTABLE_STRING;
        break;
      case ')':
        pfVar8 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        pfVar8 = &FIOBJECT_VTABLE_HASH;
        break;
      case '+':
        pfVar8 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar8 = &FIOBJECT_VTABLE_NUMBER;
      }
      (*pfVar8->to_str)(&local_188,uVar13);
    }
    else {
      fio_ltocstr(&local_188,(long)uVar13 >> 1);
    }
LAB_001485cc:
    iVar6 = 6;
    if (((int *)local_188.data == (int *)0x0) ||
       ((short)*(int *)((long)local_188.data + 4) != 0x3d73 || *(int *)local_188.data != 0x65747962)
       ) goto LAB_0014843c;
    local_168.capa = (long)local_188.data + 6;
    uVar15 = fio_atol((char **)&local_168);
    iVar6 = 6;
    uVar13 = local_c0.st_size - uVar15;
    if (uVar13 == 0 || local_c0.st_size < (long)uVar15) {
LAB_00148632:
      offset = 0;
      phVar19 = local_170;
      uVar13 = local_c0.st_size;
    }
    else {
      if ((long)uVar15 < 0) {
        lVar21 = 0;
      }
      else {
        local_168.capa = local_168.capa + 1;
        lVar21 = fio_atol((char **)&local_168);
        if (lVar21 < 1) goto LAB_00148632;
      }
      if ((long)uVar15 < 0) {
        uVar13 = -uVar15;
        bVar28 = (long)(local_c0.st_size + uVar15) < 0;
        local_148 = 0;
        if (local_c0.st_size != uVar13 && SBORROW8(local_c0.st_size,uVar13) == bVar28) {
          local_148 = local_c0.st_size - uVar15;
        }
        if (SBORROW8(local_c0.st_size,uVar13) != bVar28) {
          uVar13 = local_c0.st_size;
        }
      }
      else {
        local_148 = uVar15;
        if (lVar21 != 0) {
          uVar13 = (long)(lVar21 - uVar15) >> 0x3f & uVar15;
          if (local_c0.st_size < lVar21 + 1) {
            uVar13 = uVar15;
          }
          uVar13 = ((lVar21 - uVar15) - uVar13) + 1;
        }
      }
      local_170->status = 0xce;
      local_100 = fiobj_str_buf(1);
      iVar6 = 0;
      fiobj_str_printf(local_100,"bytes %lu-%lu/%lu",uVar15,uVar15 + uVar13 + -1,local_c0.st_size);
      http_set_header(local_170,HTTP_HEADER_CONTENT_RANGE,local_100);
      FVar12 = HTTP_HVALUE_BYTES;
      FVar9 = HTTP_HEADER_ACCEPT_RANGES;
      if ((((~(uint)HTTP_HVALUE_BYTES & 6) != 0) && (HTTP_HVALUE_BYTES != 0)) &&
         ((HTTP_HVALUE_BYTES & 1) == 0)) {
        LOCK();
        piVar1 = (int *)((HTTP_HVALUE_BYTES & 0xfffffffffffffff8) + 4);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      http_set_header(local_170,FVar9,FVar12);
      offset = local_148;
      phVar19 = local_170;
    }
  }
  else {
    fiobj_hash_delete2(phVar19->headers,http_sendfile2::range_hash);
LAB_00148439:
    iVar6 = 0;
LAB_0014843c:
    offset = 0;
    uVar13 = local_c0.st_size;
  }
  if (iVar6 != 6) {
    if (iVar6 != 0) {
      return iVar5;
    }
    uVar15 = phVar19->method;
    if (uVar15 == 0) {
LAB_00148506:
      local_188.data = anon_var_dwarf_20f;
      local_188.len._0_4_ = 4;
      goto LAB_00148519;
    }
    if ((uVar15 & 1) == 0) {
      uVar16 = (uint)uVar15 & 6;
      cVar4 = '(';
      switch(uVar16) {
      case 0:
switchD_00148479_caseD_0:
        cVar4 = *(char *)(uVar15 & 0xfffffffffffffff8);
        break;
      case 4:
switchD_00148479_caseD_4:
        cVar4 = '*';
        break;
      case 6:
        if ((char)uVar15 == '&') {
          local_188.data = anon_var_dwarf_21a;
          local_188.len._0_4_ = 5;
        }
        else {
          uVar17 = (uint)uVar15 & 0xff;
          if (uVar17 != 0x16) {
            if (uVar17 == 6) goto LAB_00148506;
            switch(uVar16) {
            case 0:
              goto switchD_00148479_caseD_0;
            case 4:
              goto switchD_00148479_caseD_4;
            case 6:
              cVar4 = (char)uVar15;
            }
            break;
          }
          local_188.data = anon_var_dwarf_225;
          local_188.len._0_4_ = 4;
        }
LAB_00148519:
        local_188.capa._0_4_ = 0;
        local_188.capa._4_4_ = 0;
        local_188.len._4_4_ = 0;
        goto LAB_001487de;
      }
      switch(cVar4) {
      case '\'':
        pfVar8 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        pfVar8 = &FIOBJECT_VTABLE_STRING;
        break;
      case ')':
        pfVar8 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        pfVar8 = &FIOBJECT_VTABLE_HASH;
        break;
      case '+':
        pfVar8 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar8 = &FIOBJECT_VTABLE_NUMBER;
      }
      (*pfVar8->to_str)(&local_188,uVar15);
    }
    else {
      fio_ltocstr(&local_188,(long)uVar15 >> 1);
    }
LAB_001487de:
    local_1a8.data = local_188.data;
    local_1a8.capa = CONCAT44(local_188.capa._4_4_,(undefined4)local_188.capa);
    local_1a8.len = CONCAT44(local_188.len._4_4_,(undefined4)local_188.len);
    if (local_1a8.len != 3) {
      if (local_1a8.len == 4) {
        iVar5 = strncasecmp("head",local_188.data,4);
        FVar7 = HTTP_HEADER_CONTENT_LENGTH;
        if (iVar5 == 0) {
          if ((long)(uVar13 + 0x4000000000000000) < 0) {
            FVar9 = fiobj_num_new_bignum(uVar13);
          }
          else {
            FVar9 = (uVar13 * 2 | uVar13 & 0x8000000000000000) + 1;
          }
          http_set_header(phVar19,FVar7,FVar9);
          http_finish(phVar19);
          return 0;
        }
      }
      else if ((local_1a8.len == 7) && (iVar5 = strncasecmp("options",local_188.data,7), iVar5 == 0)
              ) {
        local_f8[1] = 0;
        local_f8[2] = 5;
        local_e0 = "allow";
        local_d8 = 0;
        uStack_d0 = 9;
        local_c8 = "GET, HEAD";
        n.data = "allow";
        n.capa = SUB168(ZEXT816(5) << 0x40,0);
        n.len = SUB168(ZEXT816(5) << 0x40,8);
        v.data = "GET, HEAD";
        v.capa = SUB168(ZEXT816(9) << 0x40,0);
        v.len = SUB168(ZEXT816(9) << 0x40,8);
        http_set_header2(phVar19,n,v);
        phVar19->status = 200;
        http_finish(phVar19);
        return 0;
      }
LAB_00148930:
      http_send_error(phVar19,0x193);
      return 0;
    }
    iVar5 = strncasecmp("get",local_188.data,3);
    if (iVar5 != 0) goto LAB_00148930;
  }
  uVar23 = local_13c;
  if (FVar7 == 0) {
LAB_001489a6:
    local_188.data = anon_var_dwarf_20f;
    local_188.len._0_4_ = 4;
    goto LAB_001489b9;
  }
  if ((FVar7 & 1) != 0) {
    fio_ltocstr(&local_188,lVar14);
    goto LAB_00148a7f;
  }
  cVar4 = '(';
  switch(uVar26 & 6) {
  case 0:
switchD_0014896d_caseD_0:
    cVar4 = *(char *)(FVar7 & 0xfffffffffffffff8);
    break;
  case 4:
switchD_0014896d_caseD_4:
    cVar4 = '*';
    break;
  case 6:
    if (cVar25 == '&') {
      local_188.data = anon_var_dwarf_21a;
      local_188.len._0_4_ = 5;
    }
    else {
      if ((uVar26 & 0xff) != 0x16) {
        if ((uVar26 & 0xff) == 6) goto LAB_001489a6;
        switch(uVar26 & 6) {
        case 0:
          goto switchD_0014896d_caseD_0;
        case 4:
          goto switchD_0014896d_caseD_4;
        case 6:
          cVar4 = cVar25;
        }
        break;
      }
      local_188.data = anon_var_dwarf_225;
      local_188.len._0_4_ = 4;
    }
LAB_001489b9:
    local_188.capa._0_4_ = 0;
    local_188.capa._4_4_ = 0;
    local_188.len._4_4_ = 0;
    goto LAB_00148a7f;
  }
  switch(cVar4) {
  case '\'':
    pfVar8 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case '(':
    pfVar8 = &FIOBJECT_VTABLE_STRING;
    break;
  case ')':
    pfVar8 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case '*':
    pfVar8 = &FIOBJECT_VTABLE_HASH;
    break;
  case '+':
    pfVar8 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar8 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar8->to_str)(&local_188,FVar7);
LAB_00148a7f:
  local_1a8.data = local_188.data;
  local_1a8.capa = CONCAT44(local_188.capa._4_4_,(undefined4)local_188.capa);
  local_1a8.len = CONCAT44(local_188.len._4_4_,(undefined4)local_188.len);
  iVar5 = open(local_188.data,0);
  FVar9 = HTTP_HVALUE_GZIP;
  FVar7 = HTTP_HEADER_CONTENT_ENCODING;
  if (iVar5 == -1) {
    http_sendfile2_cold_1();
    return 0;
  }
  if ((char)uVar23 == '\0') {
    if ((((~(uint)HTTP_HVALUE_GZIP & 6) != 0) && (HTTP_HVALUE_GZIP != 0)) &&
       ((HTTP_HVALUE_GZIP & 1) == 0)) {
      LOCK();
      piVar1 = (int *)((HTTP_HVALUE_GZIP & 0xfffffffffffffff8) + 4);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    http_set_header(local_170,FVar7,FVar9);
    uVar15 = local_1a8.len - 4;
    if (uVar15 != 0) {
      do {
        if (*(char *)((long)local_1a8.data + uVar15) == '.') goto LAB_00148b33;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
      uVar15 = 0;
    }
LAB_00148b33:
    pcVar10 = (char *)((long)local_1a8.data + uVar15 + 1);
    sVar11 = (local_1a8.len + ~uVar15) - 3;
  }
  else {
    lVar14 = local_1a8.len + 1;
    do {
      if (lVar14 == 2) {
        lVar21 = 1;
        break;
      }
      lVar21 = lVar14 + -1;
      lVar3 = lVar14 + -2;
      lVar14 = lVar21;
    } while (*(char *)((long)local_1a8.data + lVar3) != '.');
    sVar11 = local_1a8.len - lVar21;
    pcVar10 = (char *)(lVar21 + (long)local_1a8.data);
  }
  FVar7 = http_mimetype_find(pcVar10,sVar11);
  phVar19 = local_170;
  if (FVar7 != 0) {
    http_set_header(local_170,HTTP_HEADER_CONTENT_TYPE,FVar7);
  }
  http_sendfile(phVar19,iVar5,uVar13,offset);
  return 0;
}

Assistant:

int http_sendfile2(http_s *h, const char *prefix, size_t prefix_len,
                   const char *encoded, size_t encoded_len) {
  if (HTTP_INVALID_HANDLE(h))
    return -1;
  struct stat file_data = {.st_size = 0};
  static uint64_t accept_enc_hash = 0;
  if (!accept_enc_hash)
    accept_enc_hash = fiobj_hash_string("accept-encoding", 15);
  static uint64_t range_hash = 0;
  if (!range_hash)
    range_hash = fiobj_hash_string("range", 5);

  /* create filename string */
  FIOBJ filename = fiobj_str_tmp();
  if (prefix && prefix_len) {
    /* start with prefix path */
    if (encoded && prefix[prefix_len - 1] == '/' && encoded[0] == '/')
      --prefix_len;
    fiobj_str_capa_assert(filename, prefix_len + encoded_len + 4);
    fiobj_str_write(filename, prefix, prefix_len);
  }
  {
    /* decode filename in cases where it's URL encoded */
    fio_str_info_s tmp = fiobj_obj2cstr(filename);
    if (encoded) {
      char *pos = (char *)encoded;
      const char *end = encoded + encoded_len;
      while (pos < end) {
        if (*pos == '%') {
          // decode hex value (this is a percent encoded value).
          if (hex2byte((uint8_t *)tmp.data + tmp.len, (uint8_t *)pos + 1))
            return -1;
          tmp.len++;
          pos += 3;
        } else
          tmp.data[tmp.len++] = *(pos++);
      }
      tmp.data[tmp.len] = 0;
      fiobj_str_resize(filename, tmp.len);
      /* test for path manipulations after decoding */
      if (http_test_encoded_path(tmp.data + prefix_len, tmp.len - prefix_len))
        return -1;
    }
    if (tmp.data[tmp.len - 1] == '/')
      fiobj_str_write(filename, "index.html", 10);
  }
  /* test for file existance  */

  int file = -1;
  uint8_t is_gz = 0;

  fio_str_info_s s = fiobj_obj2cstr(filename);
  {
    FIOBJ tmp = fiobj_hash_get2(h->headers, accept_enc_hash);
    if (!tmp)
      goto no_gzip_support;
    fio_str_info_s ac_str = fiobj_obj2cstr(tmp);
    if (!ac_str.data || !strstr(ac_str.data, "gzip"))
      goto no_gzip_support;
    if (s.data[s.len - 3] != '.' || s.data[s.len - 2] != 'g' ||
        s.data[s.len - 1] != 'z') {
      fiobj_str_write(filename, ".gz", 3);
      s = fiobj_obj2cstr(filename);
      if (!stat(s.data, &file_data) &&
          (S_ISREG(file_data.st_mode) || S_ISLNK(file_data.st_mode))) {
        is_gz = 1;
        goto found_file;
      }
      fiobj_str_resize(filename, s.len - 3);
    }
  }
no_gzip_support:
  if (stat(s.data, &file_data) ||
      !(S_ISREG(file_data.st_mode) || S_ISLNK(file_data.st_mode)))
    return -1;
found_file:
  /* set last-modified */
  {
    FIOBJ tmp = fiobj_str_buf(32);
    fiobj_str_resize(
        tmp, http_time2str(fiobj_obj2cstr(tmp).data, file_data.st_mtime));
    http_set_header(h, HTTP_HEADER_LAST_MODIFIED, tmp);
  }
  /* set cache-control */
  http_set_header(h, HTTP_HEADER_CACHE_CONTROL, fiobj_dup(HTTP_HVALUE_MAX_AGE));
  /* set & test etag */
  uint64_t etag = (uint64_t)file_data.st_size;
  etag ^= (uint64_t)file_data.st_mtime;
  etag = fiobj_hash_string(&etag, sizeof(uint64_t));
  FIOBJ etag_str = fiobj_str_buf(32);
  fiobj_str_resize(etag_str,
                   fio_base64_encode(fiobj_obj2cstr(etag_str).data,
                                     (void *)&etag, sizeof(uint64_t)));
  /* set */
  http_set_header(h, HTTP_HEADER_ETAG, etag_str);
  /* test */
  {
    static uint64_t none_match_hash = 0;
    if (!none_match_hash)
      none_match_hash = fiobj_hash_string("if-none-match", 13);
    FIOBJ tmp2 = fiobj_hash_get2(h->headers, none_match_hash);
    if (tmp2 && fiobj_iseq(tmp2, etag_str)) {
      h->status = 304;
      http_finish(h);
      return 0;
    }
  }
  /* handle range requests */
  int64_t offset = 0;
  int64_t length = file_data.st_size;
  {
    static uint64_t ifrange_hash = 0;
    if (!ifrange_hash)
      ifrange_hash = fiobj_hash_string("if-range", 8);
    FIOBJ tmp = fiobj_hash_get2(h->headers, ifrange_hash);
    if (tmp && fiobj_iseq(tmp, etag_str)) {
      fiobj_hash_delete2(h->headers, range_hash);
    } else {
      tmp = fiobj_hash_get2(h->headers, range_hash);
      if (tmp) {
        /* range ahead... */
        if (FIOBJ_TYPE_IS(tmp, FIOBJ_T_ARRAY))
          tmp = fiobj_ary_index(tmp, 0);
        fio_str_info_s range = fiobj_obj2cstr(tmp);
        if (!range.data || memcmp("bytes=", range.data, 6))
          goto open_file;
        char *pos = range.data + 6;
        int64_t start_at = 0, end_at = 0;
        start_at = fio_atol(&pos);
        if (start_at >= file_data.st_size)
          goto open_file;
        if (start_at >= 0) {
          pos++;
          end_at = fio_atol(&pos);
          if (end_at <= 0)
            goto open_file;
        }
        /* we ignore multimple ranges, only responding with the first range. */
        if (start_at < 0) {
          if (0 - start_at < file_data.st_size) {
            offset = file_data.st_size - start_at;
            length = 0 - start_at;
          }
        } else if (end_at) {
          offset = start_at;
          length = end_at - start_at + 1;
          if (length + start_at > file_data.st_size || length <= 0)
            length = length - start_at;
        } else {
          offset = start_at;
          length = length - start_at;
        }
        h->status = 206;

        {
          FIOBJ cranges = fiobj_str_buf(1);
          fiobj_str_printf(cranges, "bytes %lu-%lu/%lu",
                           (unsigned long)start_at,
                           (unsigned long)(start_at + length - 1),
                           (unsigned long)file_data.st_size);
          http_set_header(h, HTTP_HEADER_CONTENT_RANGE, cranges);
        }
        http_set_header(h, HTTP_HEADER_ACCEPT_RANGES,
                        fiobj_dup(HTTP_HVALUE_BYTES));
      }
    }
  }
  /* test for an OPTIONS request or invalid methods */
  s = fiobj_obj2cstr(h->method);
  switch (s.len) {
  case 7:
    if (!strncasecmp("options", s.data, 7)) {
      http_set_header2(h, (fio_str_info_s){.data = (char *)"allow", .len = 5},
                       (fio_str_info_s){.data = (char *)"GET, HEAD", .len = 9});
      h->status = 200;
      http_finish(h);
      return 0;
    }
    break;
  case 3:
    if (!strncasecmp("get", s.data, 3))
      goto open_file;
    break;
  case 4:
    if (!strncasecmp("head", s.data, 4)) {
      http_set_header(h, HTTP_HEADER_CONTENT_LENGTH, fiobj_num_new(length));
      http_finish(h);
      return 0;
    }
    break;
  }
  http_send_error(h, 403);
  return 0;
open_file:
  s = fiobj_obj2cstr(filename);
  file = open(s.data, O_RDONLY);
  if (file == -1) {
    FIO_LOG_ERROR("(HTTP) couldn't open file %s!\n", s.data);
    perror("     ");
    http_send_error(h, 500);
    return 0;
  }
  {
    FIOBJ tmp = 0;
    uintptr_t pos = 0;
    if (is_gz) {
      http_set_header(h, HTTP_HEADER_CONTENT_ENCODING,
                      fiobj_dup(HTTP_HVALUE_GZIP));

      pos = s.len - 4;
      while (pos && s.data[pos] != '.')
        pos--;
      pos++; /* assuming, but that's fine. */
      tmp = http_mimetype_find(s.data + pos, s.len - pos - 3);

    } else {
      pos = s.len - 1;
      while (pos && s.data[pos] != '.')
        pos--;
      pos++; /* assuming, but that's fine. */
      tmp = http_mimetype_find(s.data + pos, s.len - pos);
    }
    if (tmp)
      http_set_header(h, HTTP_HEADER_CONTENT_TYPE, tmp);
  }
  http_sendfile(h, file, length, offset);
  return 0;
}